

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_paramSwitch_e useRowMatchFinder;
  ZSTD_cwksp *pZVar4;
  ZSTD_cwksp *pZVar5;
  undefined8 *puVar6;
  long lVar7;
  byte bVar8;
  ZSTD_cwksp ws;
  ZSTD_CCtx_params in_stack_fffffffffffffe08;
  ZSTD_cwksp local_108 [2];
  ZSTD_paramSwitch_e local_78;
  
  bVar8 = 0;
  useRowMatchFinder = ZSTD_ps_disable;
  if (0xfffffffc < cParams.strategy - ZSTD_btlazy2) {
    useRowMatchFinder = (cParams.windowLog < 0xf) + ZSTD_ps_enable;
  }
  sVar2 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,1,0);
  lVar7 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar7 = 0x39c0;
  }
  if (((ulong)workspace & 7) == 0) {
    local_108[0].workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_108[0].allocStart = (void *)((ulong)local_108[0].workspaceEnd & 0xffffffffffffffc0);
    local_108[0].phase = ZSTD_cwksp_alloc_objects;
    local_108[0].isStatic = ZSTD_cwksp_static_alloc;
    local_108[0].allocFailed = '\0';
    local_108[0].tableEnd = workspace;
    local_108[0].tableValidEnd = workspace;
    local_108[0].initOnceStart = local_108[0].allocStart;
    local_108[0].workspace = workspace;
    local_108[0].objectEnd = workspace;
    ZSTD_cwksp_assert_internal_consistency(local_108);
    local_108[0].workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(local_108);
    ZSTD_cwksp_assert_internal_consistency(local_108);
    if ((long)workspaceSize < 0x17c0) {
      local_108[0].allocFailed = '\x01';
      workspace = (ZSTD_CDict *)0x0;
      pvVar1 = local_108[0].objectEnd;
    }
    else {
      pvVar1 = (void *)((long)workspace + 0x17c0);
      local_108[0].objectEnd._0_4_ = (uint)pvVar1;
      local_108[0].objectEnd._4_4_ = (uint)((ulong)pvVar1 >> 0x20);
      local_108[0].tableEnd = pvVar1;
      local_108[0].tableValidEnd = pvVar1;
    }
    if ((ZSTD_CDict *)workspace != (ZSTD_CDict *)0x0) {
      pZVar4 = local_108;
      pZVar5 = &((ZSTD_CDict *)workspace)->workspace;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        pZVar5->workspace = pZVar4->workspace;
        pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + ((ulong)bVar8 * -2 + 1) * 8);
        pZVar5 = (ZSTD_cwksp *)((long)pZVar5 + (ulong)bVar8 * -0x10 + 8);
      }
      if (sVar2 + lVar7 <= workspaceSize) {
        local_108[0].objectEnd = pvVar1;
        memset(local_108,0,0xd0);
        local_108[0].tableValidEnd = (void *)CONCAT44(local_108[0].tableValidEnd._4_4_,1);
        local_108[0].workspace._4_4_ = cParams.windowLog;
        local_108[0].workspaceEnd._0_4_ = cParams.chainLog;
        local_108[0].workspaceEnd._4_4_ = cParams.hashLog;
        local_108[0].objectEnd._0_4_ = cParams.searchLog;
        local_108[0].objectEnd._4_4_ = cParams.minMatch;
        local_108[0].tableEnd = (void *)CONCAT44(cParams.strategy,cParams.targetLength);
        local_78 = useRowMatchFinder;
        ((ZSTD_CDict *)workspace)->useRowMatchFinder = useRowMatchFinder;
        ((ZSTD_CDict *)workspace)->compressionLevel = 0;
        pZVar4 = local_108;
        puVar6 = (undefined8 *)&stack0xfffffffffffffe08;
        for (lVar7 = 0x1a; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar6 = pZVar4->workspace;
          pZVar4 = (ZSTD_cwksp *)((long)pZVar4 + ((ulong)bVar8 * -2 + 1) * 8);
          puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        }
        sVar2 = ZSTD_initCDict_internal
                          ((ZSTD_CDict *)workspace,dict,dictSize,dictLoadMethod,dictContentType,
                           in_stack_fffffffffffffe08);
        if (sVar2 < 0xffffffffffffff89) {
          return (ZSTD_CDict *)workspace;
        }
        return (ZSTD_CDict *)0x0;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;
    cdict->compressionLevel = ZSTD_NO_CLEVEL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}